

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

void google::protobuf::compiler::cpp::AddAccessorAnnotations
               (FieldDescriptor *descriptor,Options *options,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  StringPiece prepared_template_00;
  StringPiece prepared_template_01;
  StringPiece prepared_template_02;
  StringPiece prepared_template_03;
  StringPiece prepared_template_04;
  StringPiece prepared_template_05;
  StringPiece prepared_template_06;
  StringPiece prepared_template_07;
  StringPiece prepared_template_08;
  StringPiece prepared_template_09;
  StringPiece prepared_template_10;
  StringPiece access_type;
  StringPiece access_type_00;
  StringPiece access_type_01;
  StringPiece access_type_02;
  StringPiece access_type_03;
  StringPiece access_type_04;
  StringPiece access_type_05;
  StringPiece access_type_06;
  StringPiece access_type_07;
  StringPiece access_type_08;
  StringPiece access_type_09;
  _Alloc_hider _Var1;
  bool bVar2;
  Type TVar3;
  CppType CVar4;
  mapped_type *pmVar5;
  OneofDescriptor *pOVar6;
  size_type sVar7;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int __c_09;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  string *psVar8;
  AlphaNum *this;
  char *pcVar9;
  SubstituteArg *this_00;
  AlphaNum *in_R8;
  undefined4 uVar10;
  long lVar11;
  StringPiece substitute_template_prefix_00;
  StringPiece substitute_template_prefix_01;
  StringPiece substitute_template_prefix_02;
  StringPiece substitute_template_prefix_03;
  StringPiece substitute_template_prefix_04;
  StringPiece substitute_template_prefix_05;
  StringPiece substitute_template_prefix_06;
  StringPiece substitute_template_prefix_07;
  StringPiece substitute_template_prefix_08;
  StringPiece substitute_template_prefix_09;
  StringPiece substitute_template_prefix_10;
  AlphaNum *pAVar12;
  AlphaNum *in_stack_fffffffffffff8e8;
  allocator local_6f9;
  string substitute_template_prefix;
  string prepared_template;
  SubstituteArg local_6b8;
  string field_member;
  string prepared_flat_template;
  SubstituteArg local_640;
  AlphaNum local_610;
  AlphaNum local_5e0;
  string prepared_add_template;
  SubstituteArg local_590;
  AlphaNum local_560;
  AlphaNum local_530;
  AlphaNum local_500;
  char *local_4d0;
  size_type sStack_4c8;
  StringPiece local_4c0;
  char *local_4b0;
  size_type sStack_4a8;
  StringPiece local_4a0;
  char *local_490;
  size_type sStack_488;
  StringPiece local_480;
  char *local_470;
  size_type sStack_468;
  StringPiece local_460;
  char *local_450;
  size_type sStack_448;
  StringPiece local_440;
  char *local_430;
  size_type sStack_428;
  StringPiece local_420;
  char *local_410;
  size_type sStack_408;
  StringPiece local_400;
  char *local_3f0;
  size_type sStack_3e8;
  StringPiece local_3e0;
  char *local_3d0;
  size_type sStack_3c8;
  StringPiece local_3c0;
  char *local_3b0;
  size_type sStack_3a8;
  StringPiece local_3a0;
  char *local_390;
  size_type sStack_388;
  StringPiece local_380;
  SubstituteArg local_370;
  AlphaNum local_340;
  string field_pointer;
  string field_name;
  AlphaNum local_2d0;
  string local_2a0;
  string default_value_pointer;
  SubstituteArg local_260;
  SubstituteArg local_230;
  AlphaNum local_200;
  StringPiece local_1d0;
  StringPiece local_1c0;
  StringPiece local_1b0;
  StringPiece local_1a0;
  StringPiece local_190;
  StringPiece local_180;
  StringPiece local_170;
  StringPiece local_160;
  StringPiece local_150;
  StringPiece local_140;
  StringPiece local_130;
  undefined1 local_120 [64];
  string local_e0;
  string proto_ns;
  SubstituteArg local_a0;
  StringPiece local_70;
  SubstituteArg local_60;
  
  field = (FieldDescriptor *)variables;
  for (lVar11 = 0; lVar11 != 0x58; lVar11 = lVar11 + 8) {
    std::__cxx11::string::string
              ((string *)&local_6b8,
               *(char **)((long)AddAccessorAnnotations::kAccessorsAnnotations + lVar11),
               (allocator *)&local_610);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_6b8);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&local_6b8);
    field = extraout_RDX;
  }
  if (options->annotate_accessor == true) {
    for (lVar11 = 0; lVar11 != 0x58; lVar11 = lVar11 + 8) {
      local_6b8.text_ = "  ";
      local_6b8.size_ = 2;
      local_6b8.scratch_[0] = '\0';
      local_6b8.scratch_[1] = '\0';
      local_6b8.scratch_[2] = '\0';
      local_6b8.scratch_[3] = '\0';
      FieldName_abi_cxx11_((string *)&local_560,(cpp *)descriptor,field);
      local_610.piece_data_ = local_560.piece_data_;
      local_610.piece_size_ = local_560.piece_size_;
      local_5e0.piece_data_ = "_AccessedNoStrip = true;\n";
      local_5e0.piece_size_ = 0x19;
      StrCat_abi_cxx11_((string *)&local_500,(protobuf *)&local_6b8,&local_610,&local_5e0,in_R8);
      std::__cxx11::string::string
                ((string *)&local_2d0,
                 *(char **)((long)AddAccessorAnnotations::kAccessorsAnnotations + lVar11),
                 (allocator *)&local_530);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_2d0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_500);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_560);
      field = extraout_RDX_00;
    }
  }
  if ((options->field_listener_options).inject_field_listener_events != true) {
    return;
  }
  if (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0x78) + 0xa0) == 3) {
    return;
  }
  std::__cxx11::string::string((string *)&local_6b8,"field_member",(allocator *)&local_610);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_6b8);
  std::__cxx11::string::string((string *)&field_member,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_6b8);
  pOVar6 = FieldDescriptor::real_containing_oneof(descriptor);
  if (pOVar6 != (OneofDescriptor *)0x0) {
    local_6b8.text_ = (char *)**(undefined8 **)(pOVar6 + 8);
    local_6b8._8_8_ = (*(undefined8 **)(pOVar6 + 8))[1];
    local_610.piece_data_ = "_.";
    local_610.piece_size_ = 2;
    local_5e0.piece_size_ =
         CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length);
    local_5e0.piece_data_ = field_member._M_dataplus._M_p;
    StrCat_abi_cxx11_((string *)&local_500,(protobuf *)&local_6b8,&local_610,&local_5e0,in_R8);
    std::__cxx11::string::operator=((string *)&field_member,(string *)&local_500);
    std::__cxx11::string::~string((string *)&local_500);
  }
  std::__cxx11::string::string((string *)&local_6b8,"proto_ns",(allocator *)&local_610);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_6b8);
  std::__cxx11::string::string((string *)&proto_ns,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::string
            ((string *)&substitute_template_prefix,"  _tracker_.$1<$0>(this, ",
             (allocator *)&local_6b8);
  prepared_template._M_dataplus._M_p = (pointer)&prepared_template.field_2;
  prepared_template._M_string_length = 0;
  pAVar12 = (AlphaNum *)&prepared_flat_template.field_2;
  prepared_flat_template._M_string_length = 0;
  prepared_template.field_2._M_local_buf[0] = '\0';
  prepared_flat_template.field_2._M_local_buf[0] = '\0';
  prepared_add_template._M_dataplus._M_p = (pointer)&prepared_add_template.field_2;
  prepared_add_template._M_string_length = 0;
  prepared_add_template.field_2._M_local_buf[0] = '\0';
  prepared_flat_template._M_dataplus._M_p = (pointer)pAVar12;
  if (((~(byte)descriptor[1] & 0x60) != 0) || (bVar2 = FieldDescriptor::is_map(descriptor), bVar2))
  {
    bVar2 = FieldDescriptor::is_map(descriptor);
    psVar8 = &prepared_template;
    if ((!bVar2) &&
       ((TVar3 = FieldDescriptor::type(descriptor), TVar3 != TYPE_MESSAGE ||
        (*(char *)(*(long *)(descriptor + 0x38) + 0x4d) != '\0')))) {
      CVar4 = FieldDescriptor::cpp_type(descriptor);
      _Var1 = field_member._M_dataplus;
      if (CVar4 == CPPTYPE_STRING) {
        if (pOVar6 == (OneofDescriptor *)0x0) {
          sVar7 = stringpiece_internal::StringPiece::CheckSize
                            (CONCAT44(field_member._M_string_length._4_4_,
                                      (int)field_member._M_string_length));
          if (*(long *)(*(long *)(descriptor + 0x40) + 8) == 0) {
            local_6b8.text_ = "&";
            local_6b8.size_ = 1;
            local_6b8.scratch_[0] = '\0';
            local_6b8.scratch_[1] = '\0';
            local_6b8.scratch_[2] = '\0';
            local_6b8.scratch_[3] = '\0';
            local_610.piece_data_ = _Var1._M_p;
            local_610.piece_size_ = sVar7;
            StrCat_abi_cxx11_((string *)&local_340,(protobuf *)&local_6b8,&local_610,pAVar12);
          }
          else if (*(int *)(*(long *)(descriptor + 0x38) + 0x48) == 0) {
            std::__cxx11::string::string
                      ((string *)&local_590,"$0.IsDefault(nullptr) ? &$1.get() : $0.GetPointer()",
                       (allocator *)&local_a0);
            local_6b8.text_ = _Var1._M_p;
            local_6b8.size_ = (int)sVar7;
            MakeDefaultName_abi_cxx11_((string *)&local_640,(cpp *)descriptor,field_02);
            local_5e0.piece_data_ = (pointer)0x0;
            local_5e0.piece_size_ = CONCAT44(local_5e0.piece_size_._4_4_,0xffffffff);
            local_500.piece_data_ = (pointer)0x0;
            local_500.piece_size_ = CONCAT44(local_500.piece_size_._4_4_,0xffffffff);
            local_560.piece_data_ = (char *)0x0;
            local_560.piece_size_ = CONCAT44(local_560.piece_size_._4_4_,0xffffffff);
            local_2d0.piece_data_ = (pointer)0x0;
            local_2d0.piece_size_ = CONCAT44(local_2d0.piece_size_._4_4_,0xffffffff);
            local_530.piece_data_ = (pointer)0x0;
            pAVar12 = &local_610;
            local_530.piece_size_._0_4_ = 0xffffffff;
            local_200.piece_data_ = (char *)0x0;
            local_610.piece_data_ = local_640.text_;
            local_200.piece_size_._0_4_ = 0xffffffff;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            local_260.text_ = (char *)0x0;
            local_610.piece_size_ = CONCAT44(local_610.piece_size_._4_4_,local_640.size_);
            local_260.size_ = -1;
            strings::Substitute((string *)&local_340,(string *)&local_590,&local_6b8,
                                (SubstituteArg *)pAVar12,(SubstituteArg *)&local_5e0,
                                (SubstituteArg *)&local_500,(SubstituteArg *)&local_560,
                                (SubstituteArg *)&local_2d0,(SubstituteArg *)&local_530,
                                (SubstituteArg *)&local_200,&local_230,&local_260);
            std::__cxx11::string::~string((string *)&local_640);
            std::__cxx11::string::~string((string *)&local_590);
          }
          else {
            local_6b8.text_ = "&";
            local_6b8.size_ = 1;
            local_6b8.scratch_[0] = '\0';
            local_6b8.scratch_[1] = '\0';
            local_6b8.scratch_[2] = '\0';
            local_6b8.scratch_[3] = '\0';
            local_610.piece_data_ = _Var1._M_p;
            local_610.piece_size_ = sVar7;
            StrCat_abi_cxx11_((string *)&local_340,(protobuf *)&local_6b8,&local_610,pAVar12);
          }
          this = &local_340;
          goto LAB_00306a4b;
        }
        std::__cxx11::string::string((string *)local_120,"proto_ns",&local_6f9);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](variables,(key_type *)local_120);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_70,pmVar5);
        _Var1 = field_member._M_dataplus;
        sVar7 = stringpiece_internal::StringPiece::CheckSize
                          (CONCAT44(field_member._M_string_length._4_4_,
                                    (int)field_member._M_string_length));
        FieldName_abi_cxx11_(&field_name,(cpp *)descriptor,field_00);
        pcVar9 = "$0";
        if (*(int *)(*(long *)(descriptor + 0x38) + 0x48) == 0) {
          pcVar9 = "$0.GetPointer()";
        }
        std::__cxx11::string::string((string *)&field_pointer,pcVar9,(allocator *)&local_6b8);
        uVar10 = (undefined4)sVar7;
        if (*(long *)(*(long *)(descriptor + 0x40) + 8) == 0) {
          local_6b8.text_ = "_internal_has_";
          local_6b8.size_ = 0xe;
          local_6b8.scratch_[0] = '\0';
          local_6b8.scratch_[1] = '\0';
          local_6b8.scratch_[2] = '\0';
          local_6b8.scratch_[3] = '\0';
          local_610.piece_data_ = field_name._M_dataplus._M_p;
          local_610.piece_size_ = field_name._M_string_length;
          local_5e0.piece_data_ = "() ? ";
          local_5e0.piece_size_ = 5;
          local_500.piece_data_ = field_pointer._M_dataplus._M_p;
          local_500.piece_size_ = field_pointer._M_string_length;
          local_560.piece_data_ = ": nullptr";
          local_560.piece_size_ = 9;
          StrCat_abi_cxx11_((string *)&local_370,(protobuf *)&local_6b8,&local_610,&local_5e0,
                            &local_500,&local_560,in_stack_fffffffffffff8e8);
          pAVar12 = &local_530;
          local_530.piece_data_ = (pointer)0x0;
          local_530.piece_size_._0_4_ = 0xffffffff;
          local_200.piece_data_ = (char *)0x0;
          local_200.piece_size_._0_4_ = 0xffffffff;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_590.text_ = (char *)0x0;
          local_590.size_ = -1;
          local_640.text_ = (char *)0x0;
          local_640.size_ = -1;
          local_340.piece_data_ = (char *)0x0;
          local_340.piece_size_._0_4_ = 0xffffffff;
          local_a0.text_ = (char *)0x0;
          local_2d0.piece_data_ = _Var1._M_p;
          local_a0.size_ = -1;
          local_60.text_ = (char *)0x0;
          local_2d0.piece_size_ = CONCAT44(local_2d0.piece_size_._4_4_,uVar10);
          local_60.size_ = -1;
          strings::Substitute((string *)(local_120 + 0x20),(string *)&local_370,
                              (SubstituteArg *)&local_2d0,(SubstituteArg *)pAVar12,
                              (SubstituteArg *)&local_200,&local_230,&local_260,&local_590,
                              &local_640,(SubstituteArg *)&local_340,&local_a0,&local_60);
LAB_003066b7:
          this_00 = &local_370;
        }
        else {
          if (*(int *)(*(long *)(descriptor + 0x38) + 0x48) == 2) {
            local_6b8.text_ = "_internal_has_";
            local_6b8.size_ = 0xe;
            local_6b8.scratch_[0] = '\0';
            local_6b8.scratch_[1] = '\0';
            local_6b8.scratch_[2] = '\0';
            local_6b8.scratch_[3] = '\0';
            local_610.piece_data_ = field_name._M_dataplus._M_p;
            local_610.piece_size_ = field_name._M_string_length;
            local_5e0.piece_data_ = "() ? ";
            local_5e0.piece_size_ = 5;
            local_500.piece_data_ = field_pointer._M_dataplus._M_p;
            local_500.piece_size_ = field_pointer._M_string_length;
            local_560.piece_data_ = ": nullptr";
            local_560.piece_size_ = 9;
            StrCat_abi_cxx11_((string *)&local_370,(protobuf *)&local_6b8,&local_610,&local_5e0,
                              &local_500,&local_560,in_stack_fffffffffffff8e8);
            pAVar12 = &local_530;
            local_530.piece_data_ = (pointer)0x0;
            local_530.piece_size_._0_4_ = 0xffffffff;
            local_200.piece_data_ = (char *)0x0;
            local_200.piece_size_._0_4_ = 0xffffffff;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            local_260.text_ = (char *)0x0;
            local_260.size_ = -1;
            local_590.text_ = (char *)0x0;
            local_590.size_ = -1;
            local_640.text_ = (char *)0x0;
            local_640.size_ = -1;
            local_340.piece_data_ = (char *)0x0;
            local_340.piece_size_._0_4_ = 0xffffffff;
            local_a0.text_ = (char *)0x0;
            local_2d0.piece_data_ = _Var1._M_p;
            local_a0.size_ = -1;
            local_60.text_ = (char *)0x0;
            local_2d0.piece_size_ = CONCAT44(local_2d0.piece_size_._4_4_,uVar10);
            local_60.size_ = -1;
            strings::Substitute((string *)(local_120 + 0x20),(string *)&local_370,
                                (SubstituteArg *)&local_2d0,(SubstituteArg *)pAVar12,
                                (SubstituteArg *)&local_200,&local_230,&local_260,&local_590,
                                &local_640,(SubstituteArg *)&local_340,&local_a0,&local_60);
            goto LAB_003066b7;
          }
          pcVar9 = "&$1";
          if (*(int *)(*(long *)(descriptor + 0x38) + 0x48) == 0) {
            pcVar9 = "&$1.get()";
          }
          pAVar12 = (AlphaNum *)0x3066ea;
          std::__cxx11::string::string
                    ((string *)&default_value_pointer,pcVar9,(allocator *)&local_6b8);
          local_6b8.text_ = "_internal_has_";
          local_6b8.size_ = 0xe;
          local_6b8.scratch_[0] = '\0';
          local_6b8.scratch_[1] = '\0';
          local_6b8.scratch_[2] = '\0';
          local_6b8.scratch_[3] = '\0';
          local_610.piece_data_ = field_name._M_dataplus._M_p;
          local_610.piece_size_ = field_name._M_string_length;
          local_5e0.piece_data_ = "() ? ";
          local_5e0.piece_size_ = 5;
          local_500.piece_data_ = field_pointer._M_dataplus._M_p;
          local_500.piece_size_ = field_pointer._M_string_length;
          local_560.piece_data_ = " : ";
          local_560.piece_size_ = 3;
          local_2d0.piece_data_ = default_value_pointer._M_dataplus._M_p;
          local_2d0.piece_size_ = default_value_pointer._M_string_length;
          StrCat_abi_cxx11_(&local_e0,(protobuf *)&local_6b8,&local_610,&local_5e0,&local_500,
                            &local_560,&local_2d0,pAVar12);
          local_530.piece_data_ = _Var1._M_p;
          local_530.piece_size_._0_4_ = uVar10;
          MakeDefaultName_abi_cxx11_(&local_2a0,(cpp *)descriptor,field_01);
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          local_260.text_ = (char *)0x0;
          local_260.size_ = -1;
          local_590.text_ = (char *)0x0;
          local_590.size_ = -1;
          local_640.text_ = (char *)0x0;
          local_640.size_ = -1;
          local_340.piece_data_ = (char *)0x0;
          pAVar12 = &local_200;
          local_340.piece_size_._0_4_ = 0xffffffff;
          local_a0.text_ = (char *)0x0;
          local_200.piece_data_ = local_2a0._M_dataplus._M_p;
          local_a0.size_ = -1;
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_370.text_ = (char *)0x0;
          local_200.piece_size_._0_4_ = (undefined4)local_2a0._M_string_length;
          local_370.size_ = -1;
          strings::Substitute((string *)(local_120 + 0x20),&local_e0,(SubstituteArg *)&local_530,
                              (SubstituteArg *)pAVar12,&local_230,&local_260,&local_590,&local_640,
                              (SubstituteArg *)&local_340,&local_a0,&local_60,&local_370);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_e0);
          this_00 = (SubstituteArg *)&default_value_pointer;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::~string((string *)&field_pointer);
        std::__cxx11::string::~string((string *)&field_name);
        std::__cxx11::string::operator=((string *)&prepared_template,(string *)(local_120 + 0x20));
        std::__cxx11::string::~string((string *)(local_120 + 0x20));
        this = (AlphaNum *)local_120;
      }
      else {
        local_6b8.text_ = "&";
        local_6b8.size_ = 1;
        local_6b8.scratch_[0] = '\0';
        local_6b8.scratch_[1] = '\0';
        local_6b8.scratch_[2] = '\0';
        local_6b8.scratch_[3] = '\0';
        local_610.piece_size_ =
             CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length);
        local_610.piece_data_ = field_member._M_dataplus._M_p;
        StrCat_abi_cxx11_((string *)&local_5e0,(protobuf *)&local_6b8,&local_610,pAVar12);
        this = &local_5e0;
LAB_00306a4b:
        std::__cxx11::string::operator=((string *)&prepared_template,(string *)this);
      }
      std::__cxx11::string::~string((string *)this);
      goto LAB_00306a5b;
    }
  }
  else {
    TVar3 = FieldDescriptor::type(descriptor);
    if ((TVar3 != TYPE_MESSAGE) && (TVar3 = FieldDescriptor::type(descriptor), TVar3 != TYPE_GROUP))
    {
      std::__cxx11::string::string((string *)&local_640,"&$0.Get(index)",(allocator *)&local_340);
      local_610.piece_data_ = (char *)0x0;
      local_610.piece_size_._0_4_ = 0xffffffff;
      local_5e0.piece_data_ = (char *)0x0;
      local_5e0.piece_size_._0_4_ = 0xffffffff;
      local_500.piece_data_ = (char *)0x0;
      local_500.piece_size_._0_4_ = 0xffffffff;
      local_560.piece_data_ = (char *)0x0;
      local_560.piece_size_._0_4_ = 0xffffffff;
      local_2d0.piece_data_ = (char *)0x0;
      local_2d0.piece_size_._0_4_ = 0xffffffff;
      local_530.piece_data_ = (char *)0x0;
      local_530.piece_size_._0_4_ = 0xffffffff;
      local_200.piece_data_ = (char *)0x0;
      local_6b8.text_ = field_member._M_dataplus._M_p;
      local_200.piece_size_._0_4_ = 0xffffffff;
      local_230.text_ = (char *)0x0;
      local_230.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_260.size_ = -1;
      strings::Substitute((string *)&local_590,(string *)&local_640,&local_6b8,
                          (SubstituteArg *)&local_610,(SubstituteArg *)&local_5e0,
                          (SubstituteArg *)&local_500,(SubstituteArg *)&local_560,
                          (SubstituteArg *)&local_2d0,(SubstituteArg *)&local_530,
                          (SubstituteArg *)&local_200,&local_230,&local_260);
      std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::string
                ((string *)&local_640,"&$0.Get($0.size() - 1)",(allocator *)&local_340);
      pAVar12 = &local_610;
      local_610.piece_data_ = (char *)0x0;
      local_610.piece_size_ = CONCAT44(local_610.piece_size_._4_4_,0xffffffff);
      local_5e0.piece_data_ = (pointer)0x0;
      local_5e0.piece_size_ = CONCAT44(local_5e0.piece_size_._4_4_,0xffffffff);
      local_500.piece_data_ = (pointer)0x0;
      local_500.piece_size_ = CONCAT44(local_500.piece_size_._4_4_,0xffffffff);
      local_560.piece_data_ = (char *)0x0;
      local_560.piece_size_ = CONCAT44(local_560.piece_size_._4_4_,0xffffffff);
      local_2d0.piece_data_ = (pointer)0x0;
      local_2d0.piece_size_ = CONCAT44(local_2d0.piece_size_._4_4_,0xffffffff);
      local_530.piece_data_ = (pointer)0x0;
      local_530.piece_size_._0_4_ = 0xffffffff;
      local_200.piece_data_ = (char *)0x0;
      local_200.piece_size_._0_4_ = 0xffffffff;
      local_230.text_ = (char *)0x0;
      local_6b8.text_ = field_member._M_dataplus._M_p;
      local_230.size_ = -1;
      local_260.text_ = (char *)0x0;
      local_6b8.size_ = (int)field_member._M_string_length;
      local_260.size_ = -1;
      strings::Substitute((string *)&local_590,(string *)&local_640,&local_6b8,
                          (SubstituteArg *)pAVar12,(SubstituteArg *)&local_5e0,
                          (SubstituteArg *)&local_500,(SubstituteArg *)&local_560,
                          (SubstituteArg *)&local_2d0,(SubstituteArg *)&local_530,
                          (SubstituteArg *)&local_200,&local_230,&local_260);
      std::__cxx11::string::operator=((string *)&prepared_add_template,(string *)&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_640);
      goto LAB_00306a5b;
    }
    std::__cxx11::string::assign((char *)&prepared_template);
    psVar8 = &prepared_add_template;
  }
  std::__cxx11::string::assign((char *)psVar8);
LAB_00306a5b:
  if (((((~(byte)descriptor[1] & 0x60) != 0) || (bVar2 = FieldDescriptor::is_map(descriptor), bVar2)
       ) || (TVar3 = FieldDescriptor::type(descriptor), TVar3 == TYPE_MESSAGE)) ||
     (TVar3 = FieldDescriptor::type(descriptor), TVar3 == TYPE_GROUP)) {
    std::__cxx11::string::_M_assign((string *)&prepared_flat_template);
  }
  else {
    local_6b8.text_ = "&";
    local_6b8.size_ = 1;
    local_6b8.scratch_[0] = '\0';
    local_6b8.scratch_[1] = '\0';
    local_6b8.scratch_[2] = '\0';
    local_6b8.scratch_[3] = '\0';
    local_610.piece_size_ =
         CONCAT44(field_member._M_string_length._4_4_,(int)field_member._M_string_length);
    local_610.piece_data_ = field_member._M_dataplus._M_p;
    StrCat_abi_cxx11_((string *)&local_5e0,(protobuf *)&local_6b8,&local_610,pAVar12);
    std::__cxx11::string::operator=((string *)&prepared_flat_template,(string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  pcVar9 = "get";
  stringpiece_internal::StringPiece::StringPiece(&local_380,"get");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_390 = prepared_template._M_dataplus._M_p;
  sStack_388 = stringpiece_internal::StringPiece::CheckSize(prepared_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c);
  stringpiece_internal::StringPiece::StringPiece(&local_130,"OnGet");
  prepared_template_00.length_ = sStack_388;
  prepared_template_00.ptr_ = local_390;
  access_type.length_ = local_130.length_;
  access_type.ptr_ = local_130.ptr_;
  substitute_template_prefix_00.length_ = sVar7;
  substitute_template_prefix_00.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_380,substitute_template_prefix_00,prepared_template_00,(int)pcVar9,
             access_type,variables);
  pcVar9 = "set";
  stringpiece_internal::StringPiece::StringPiece(&local_3a0,"set");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_3b0 = prepared_template._M_dataplus._M_p;
  sStack_3a8 = stringpiece_internal::StringPiece::CheckSize(prepared_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_00);
  stringpiece_internal::StringPiece::StringPiece(&local_140,"OnSet");
  prepared_template_01.length_ = sStack_3a8;
  prepared_template_01.ptr_ = local_3b0;
  access_type_00.length_ = local_140.length_;
  access_type_00.ptr_ = local_140.ptr_;
  substitute_template_prefix_01.length_ = sVar7;
  substitute_template_prefix_01.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_3a0,substitute_template_prefix_01,prepared_template_01,(int)pcVar9,
             access_type_00,variables);
  pcVar9 = "has";
  stringpiece_internal::StringPiece::StringPiece(&local_3c0,"has");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_3d0 = prepared_template._M_dataplus._M_p;
  sStack_3c8 = stringpiece_internal::StringPiece::CheckSize(prepared_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_01);
  stringpiece_internal::StringPiece::StringPiece(&local_150,"OnHas");
  prepared_template_02.length_ = sStack_3c8;
  prepared_template_02.ptr_ = local_3d0;
  access_type_01.length_ = local_150.length_;
  access_type_01.ptr_ = local_150.ptr_;
  substitute_template_prefix_02.length_ = sVar7;
  substitute_template_prefix_02.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_3c0,substitute_template_prefix_02,prepared_template_02,(int)pcVar9,
             access_type_01,variables);
  pcVar9 = "mutable";
  stringpiece_internal::StringPiece::StringPiece(&local_3e0,"mutable");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_3f0 = prepared_template._M_dataplus._M_p;
  sStack_3e8 = stringpiece_internal::StringPiece::CheckSize(prepared_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_02);
  stringpiece_internal::StringPiece::StringPiece(&local_160,"OnMutable");
  prepared_template_03.length_ = sStack_3e8;
  prepared_template_03.ptr_ = local_3f0;
  access_type_02.length_ = local_160.length_;
  access_type_02.ptr_ = local_160.ptr_;
  substitute_template_prefix_03.length_ = sVar7;
  substitute_template_prefix_03.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_3e0,substitute_template_prefix_03,prepared_template_03,(int)pcVar9,
             access_type_02,variables);
  pcVar9 = "release";
  stringpiece_internal::StringPiece::StringPiece(&local_400,"release");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_410 = prepared_template._M_dataplus._M_p;
  sStack_408 = stringpiece_internal::StringPiece::CheckSize(prepared_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_03);
  stringpiece_internal::StringPiece::StringPiece(&local_170,"OnRelease");
  prepared_template_04.length_ = sStack_408;
  prepared_template_04.ptr_ = local_410;
  access_type_03.length_ = local_170.length_;
  access_type_03.ptr_ = local_170.ptr_;
  substitute_template_prefix_04.length_ = sVar7;
  substitute_template_prefix_04.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_400,substitute_template_prefix_04,prepared_template_04,(int)pcVar9,
             access_type_03,variables);
  pcVar9 = "clear";
  stringpiece_internal::StringPiece::StringPiece(&local_420,"clear");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_430 = prepared_flat_template._M_dataplus._M_p;
  sStack_428 = stringpiece_internal::StringPiece::CheckSize(prepared_flat_template._M_string_length)
  ;
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_04);
  stringpiece_internal::StringPiece::StringPiece(&local_180,"OnClear");
  prepared_template_05.length_ = sStack_428;
  prepared_template_05.ptr_ = local_430;
  access_type_04.length_ = local_180.length_;
  access_type_04.ptr_ = local_180.ptr_;
  substitute_template_prefix_05.length_ = sVar7;
  substitute_template_prefix_05.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_420,substitute_template_prefix_05,prepared_template_05,(int)pcVar9,
             access_type_04,variables);
  pcVar9 = "size";
  stringpiece_internal::StringPiece::StringPiece(&local_440,"size");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_450 = prepared_flat_template._M_dataplus._M_p;
  sStack_448 = stringpiece_internal::StringPiece::CheckSize(prepared_flat_template._M_string_length)
  ;
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_05);
  stringpiece_internal::StringPiece::StringPiece(&local_190,"OnSize");
  prepared_template_06.length_ = sStack_448;
  prepared_template_06.ptr_ = local_450;
  access_type_05.length_ = local_190.length_;
  access_type_05.ptr_ = local_190.ptr_;
  substitute_template_prefix_06.length_ = sVar7;
  substitute_template_prefix_06.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_440,substitute_template_prefix_06,prepared_template_06,(int)pcVar9,
             access_type_05,variables);
  pcVar9 = "list";
  stringpiece_internal::StringPiece::StringPiece(&local_460,"list");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_470 = prepared_flat_template._M_dataplus._M_p;
  sStack_468 = stringpiece_internal::StringPiece::CheckSize(prepared_flat_template._M_string_length)
  ;
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_06);
  stringpiece_internal::StringPiece::StringPiece(&local_1a0,"OnList");
  prepared_template_07.length_ = sStack_468;
  prepared_template_07.ptr_ = local_470;
  access_type_06.length_ = local_1a0.length_;
  access_type_06.ptr_ = local_1a0.ptr_;
  substitute_template_prefix_07.length_ = sVar7;
  substitute_template_prefix_07.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_460,substitute_template_prefix_07,prepared_template_07,(int)pcVar9,
             access_type_06,variables);
  pcVar9 = "mutable_list";
  stringpiece_internal::StringPiece::StringPiece(&local_480,"mutable_list");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_490 = prepared_flat_template._M_dataplus._M_p;
  sStack_488 = stringpiece_internal::StringPiece::CheckSize(prepared_flat_template._M_string_length)
  ;
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_07);
  stringpiece_internal::StringPiece::StringPiece(&local_1b0,"OnMutableList");
  prepared_template_08.length_ = sStack_488;
  prepared_template_08.ptr_ = local_490;
  access_type_07.length_ = local_1b0.length_;
  access_type_07.ptr_ = local_1b0.ptr_;
  substitute_template_prefix_08.length_ = sVar7;
  substitute_template_prefix_08.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_480,substitute_template_prefix_08,prepared_template_08,(int)pcVar9,
             access_type_07,variables);
  pcVar9 = "add";
  stringpiece_internal::StringPiece::StringPiece(&local_4a0,"add");
  _Var1 = substitute_template_prefix._M_dataplus;
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_4b0 = prepared_add_template._M_dataplus._M_p;
  sStack_4a8 = stringpiece_internal::StringPiece::CheckSize(prepared_add_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_08);
  stringpiece_internal::StringPiece::StringPiece(&local_1c0,"OnAdd");
  prepared_template_09.length_ = sStack_4a8;
  prepared_template_09.ptr_ = local_4b0;
  access_type_08.length_ = local_1c0.length_;
  access_type_08.ptr_ = local_1c0.ptr_;
  substitute_template_prefix_09.length_ = sVar7;
  substitute_template_prefix_09.ptr_ = _Var1._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_4a0,substitute_template_prefix_09,prepared_template_09,(int)pcVar9,
             access_type_08,variables);
  pcVar9 = "add_mutable";
  stringpiece_internal::StringPiece::StringPiece(&local_4c0,"add_mutable");
  sVar7 = stringpiece_internal::StringPiece::CheckSize(substitute_template_prefix._M_string_length);
  local_4d0 = prepared_add_template._M_dataplus._M_p;
  sStack_4c8 = stringpiece_internal::StringPiece::CheckSize(prepared_add_template._M_string_length);
  pcVar9 = FieldDescriptor::index(descriptor,pcVar9,__c_09);
  stringpiece_internal::StringPiece::StringPiece(&local_1d0,"OnAddMutable");
  prepared_template_10.length_ = sStack_4c8;
  prepared_template_10.ptr_ = local_4d0;
  access_type_09.length_ = local_1d0.length_;
  access_type_09.ptr_ = local_1d0.ptr_;
  substitute_template_prefix_10.length_ = sVar7;
  substitute_template_prefix_10.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  anon_unknown_7::MaySetAnnotationVariable
            (options,local_4c0,substitute_template_prefix_10,prepared_template_10,(int)pcVar9,
             access_type_09,variables);
  std::__cxx11::string::~string((string *)&prepared_add_template);
  std::__cxx11::string::~string((string *)&prepared_flat_template);
  std::__cxx11::string::~string((string *)&prepared_template);
  std::__cxx11::string::~string((string *)&substitute_template_prefix);
  std::__cxx11::string::~string((string *)&proto_ns);
  std::__cxx11::string::~string((string *)&field_member);
  return;
}

Assistant:

void AddAccessorAnnotations(const FieldDescriptor* descriptor,
                            const Options& options,
                            std::map<std::string, std::string>* variables) {
  // Can be expanded to include more specific calls, for example, for arena or
  // clear calls.
  static constexpr const char* kAccessorsAnnotations[] = {
      "annotate_add",     "annotate_get",         "annotate_has",
      "annotate_list",    "annotate_mutable",     "annotate_mutable_list",
      "annotate_release", "annotate_set",         "annotate_size",
      "annotate_clear",   "annotate_add_mutable",
  };
  for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
    (*variables)[kAccessorsAnnotations[i]] = "";
  }
  if (options.annotate_accessor) {
    for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
      (*variables)[kAccessorsAnnotations[i]] = StrCat(
          "  ", FieldName(descriptor), "_AccessedNoStrip = true;\n");
    }
  }
  if (!options.field_listener_options.inject_field_listener_events) {
    return;
  }
  if (descriptor->file()->options().optimize_for() ==
      google::protobuf::FileOptions::LITE_RUNTIME) {
    return;
  }
  std::string field_member = (*variables)["field_member"];
  const google::protobuf::OneofDescriptor* oneof_member =
      descriptor->real_containing_oneof();
  if (oneof_member) {
    field_member = StrCat(oneof_member->name(), "_.", field_member);
  }
  const std::string proto_ns = (*variables)["proto_ns"];
  const std::string substitute_template_prefix = "  _tracker_.$1<$0>(this, ";
  std::string prepared_template;

  // Flat template is needed if the prepared one is introspecting the values
  // inside the returned values, for example, for repeated fields and maps.
  std::string prepared_flat_template;
  std::string prepared_add_template;
  // TODO(b/190614678): Support fields with type Message or Map.
  if (descriptor->is_repeated() && !descriptor->is_map()) {
    if (descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
        descriptor->type() != FieldDescriptor::TYPE_GROUP) {
      prepared_template = strings::Substitute("&$0.Get(index)", field_member);
      prepared_add_template =
          strings::Substitute("&$0.Get($0.size() - 1)", field_member);
    } else {
      prepared_template = "nullptr";
      prepared_add_template = "nullptr";
    }
  } else if (descriptor->is_map()) {
    prepared_template = "nullptr";
  } else if (descriptor->type() == FieldDescriptor::TYPE_MESSAGE &&
             !descriptor->options().lazy()) {
    prepared_template = "nullptr";
  } else if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    if (oneof_member) {
      prepared_template = GenerateTemplateForOneofString(
          descriptor, (*variables)["proto_ns"], field_member);
    } else {
      prepared_template =
          GenerateTemplateForSingleString(descriptor, field_member);
    }
  } else {
    prepared_template = StrCat("&", field_member);
  }
  if (descriptor->is_repeated() && !descriptor->is_map() &&
      descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
      descriptor->type() != FieldDescriptor::TYPE_GROUP) {
    prepared_flat_template = StrCat("&", field_member);
  } else {
    prepared_flat_template = prepared_template;
  }

  MaySetAnnotationVariable(options, "get", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnGet",
                           variables);
  MaySetAnnotationVariable(options, "set", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnSet",
                           variables);
  MaySetAnnotationVariable(options, "has", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnHas",
                           variables);
  MaySetAnnotationVariable(options, "mutable", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnMutable",
                           variables);
  MaySetAnnotationVariable(options, "release", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnRelease",
                           variables);
  MaySetAnnotationVariable(options, "clear", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnClear", variables);
  MaySetAnnotationVariable(options, "size", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnSize", variables);
  MaySetAnnotationVariable(options, "list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnList", variables);
  MaySetAnnotationVariable(options, "mutable_list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnMutableList", variables);
  MaySetAnnotationVariable(options, "add", substitute_template_prefix,
                           prepared_add_template, descriptor->index(), "OnAdd",
                           variables);
  MaySetAnnotationVariable(options, "add_mutable", substitute_template_prefix,
                           prepared_add_template, descriptor->index(),
                           "OnAddMutable", variables);
}